

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O0

string * cmrc::detail::normalize_path(string *__return_storage_ptr__,string *path)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  difference_type local_38;
  size_type off;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  string *local_18;
  string *path_local;
  
  local_18 = path;
  path_local = __return_storage_ptr__;
  while (lVar2 = std::__cxx11::string::find((char *)path,0x10800f), lVar2 == 0) {
    local_28._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
    off = std::__cxx11::string::erase(path,local_20);
  }
  while( true ) {
    uVar1 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar1 & 1) == 0) {
      lVar2 = std::__cxx11::string::rfind((char *)path,0x10800f);
      lVar3 = std::__cxx11::string::size();
      bVar4 = lVar2 == lVar3 + -1;
    }
    if (!bVar4) break;
    std::__cxx11::string::pop_back();
  }
  local_38 = -1;
  while (local_38 = std::__cxx11::string::find((char *)path,0x10800e), local_38 != -1) {
    local_50._M_current = (char *)std::__cxx11::string::begin();
    local_48 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_50,local_38);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
    std::__cxx11::string::erase(path,local_40);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

inline std::string normalize_path(std::string path) {
    while (path.find("/") == 0) {
        path.erase(path.begin());
    }
    while (!path.empty() && (path.rfind("/") == path.size() - 1)) {
        path.pop_back();
    }
    auto off = path.npos;
    while ((off = path.find("//")) != path.npos) {
        path.erase(path.begin() + static_cast<std::string::difference_type>(off));
    }
    return path;
}